

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall
TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
EquationsToDecompose
          (TPZFrontMatrix<long_double,_TPZStackEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
           *this,TPZVec<long> *destinationindex,int64_t *lower_eq,int64_t *upper_eq)

{
  int *piVar1;
  long *plVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = destinationindex->fNElements;
  if (0 < lVar4) {
    plVar2 = destinationindex->fStore;
    piVar3 = (this->fNumElConnected).fStore;
    lVar5 = 0;
    do {
      piVar1 = piVar3 + plVar2[lVar5];
      *piVar1 = *piVar1 + -1;
      lVar5 = lVar5 + 1;
    } while (lVar4 != lVar5);
  }
  *upper_eq = this->fLastDecomposed;
  *lower_eq = this->fLastDecomposed + 1;
  lVar4 = *upper_eq;
  if (lVar4 < this->fNumEq + -1) {
    piVar3 = (this->fNumElConnected).fStore;
    do {
      if (piVar3[lVar4 + 1] != 0) break;
      lVar4 = lVar4 + 1;
      *upper_eq = lVar4;
    } while (lVar4 < this->fNumEq + -1);
  }
  this->fLastDecomposed = lVar4;
  return;
}

Assistant:

inline int64_t NElements() const { return fNElements; }